

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmMMU_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmPLoad<(moira::Instr)183,(moira::Mode)8,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  char *pcVar8;
  char cVar9;
  anon_class_4_1_ba1d4581 preg;
  Ea<(moira::Mode)8,_4> ea;
  u32 local_44;
  ushort local_40;
  uint local_3c;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  local_40 = op & 7;
  local_44 = *addr;
  *addr = local_44 + 2;
  iVar5 = (*this->_vptr_Moira[6])(this);
  *addr = *addr + 2;
  uVar6 = (*this->_vptr_Moira[6])(this);
  local_3c = uVar6 & 0xffff | iVar5 << 0x10;
  if (((str->style->syntax & ~MOIRA_MIT) == GNU) && (0xfffffff9 < (uVar4 & 0x1e) - 8)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)183,(moira::Mode)8,4>(this,str,addr,op);
    return;
  }
  cVar9 = 'p';
  lVar7 = 1;
  do {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = cVar9;
    cVar9 = "pload"[lVar7];
    lVar7 = lVar7 + 1;
  } while (lVar7 != 6);
  pcVar8 = "r";
  if (((uVar4 & 0xffff) >> 9 & 1) == 0) {
    pcVar8 = "w";
  }
  cVar9 = *pcVar8;
  while (cVar9 != '\0') {
    pcVar8 = pcVar8 + 1;
    pcVar3 = str->ptr;
    str->ptr = pcVar3 + 1;
    *pcVar3 = cVar9;
    cVar9 = *pcVar8;
  }
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  else {
    iVar5 = (str->tab).raw;
    pcVar8 = str->ptr;
    do {
      str->ptr = pcVar8 + 1;
      *pcVar8 = ' ';
      pcVar8 = str->ptr;
    } while (pcVar8 < str->base + iVar5);
  }
  StrWriter::operator<<(str,(Fc)(uVar4 & 0x1f));
  pcVar8 = str->ptr;
  str->ptr = pcVar8 + 1;
  *pcVar8 = ',';
  SVar2 = str->style->syntax;
  if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
    pcVar8 = str->ptr;
    str->ptr = pcVar8 + 1;
    *pcVar8 = ' ';
  }
  StrWriter::operator<<(str,(Ea<(moira::Mode)8,_4> *)&local_44);
  return;
}

Assistant:

void
Moira::dasmPLoad(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead<Word>(addr);
    auto ea  = Op <M,S> ( _____________xxx(op), addr );

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtMMU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    str << Ins<I>{} << ((ext & 0x200) ? "r" : "w") << str.tab;
    str << Fc(ext & 0b11111) << Sep{} << ea;
}